

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,SQChar *sourcename,
                   SQBool raiseerror)

{
  bool bVar1;
  SQClosure *x;
  SQWeakRef *in_RDI;
  uint uVar2;
  SQObjectPtr o;
  undefined1 in_stack_0000025e;
  undefined1 in_stack_0000025f;
  SQObjectPtr *in_stack_00000260;
  SQChar *in_stack_00000268;
  SQUserPointer in_stack_00000270;
  SQLEXREADFUNC in_stack_00000278;
  SQVM *in_stack_00000280;
  SQObjectType in_stack_ffffffffffffff5c;
  SQVM *in_stack_ffffffffffffff60;
  SQFunctionProto *func;
  SQObjectPtr local_60 [2];
  SQObjectPtr local_40 [3];
  SQWeakRef *local_10;
  SQRESULT local_8;
  
  local_10 = in_RDI;
  SQObjectPtr::SQObjectPtr(local_40);
  uVar2 = *(byte *)(local_10[7].super_SQRefCounted._vptr_SQRefCounted + 0x2b) & 1;
  bVar1 = Compile(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                  in_stack_00000260,(bool)in_stack_0000025f,(bool)in_stack_0000025e);
  if (bVar1) {
    func = (SQFunctionProto *)local_10[7].super_SQRefCounted._vptr_SQRefCounted;
    SQRefCounted::GetWeakRef((SQRefCounted *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    x = SQClosure::Create(local_40[0].super_SQObject._unVal.pClosure,func,local_10);
    SQObjectPtr::SQObjectPtr(local_60,x);
    SQVM::Push(in_stack_ffffffffffffff60,(SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff5c,uVar2));
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  return local_8;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,const SQChar *sourcename,SQBool raiseerror)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, read, p, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o), _table(v->_roottable)->GetWeakRef(OT_TABLE)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}